

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void xmlXPathNormalizeFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlXPathContextPtr pxVar1;
  ulong in_RAX;
  xmlChar *pxVar2;
  xmlXPathObjectPtr pxVar3;
  xmlBufPtr buf;
  ulong uVar4;
  xmlXPathObjectPtr value;
  int error;
  byte *str;
  xmlChar blank;
  undefined8 uStack_38;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  uStack_38 = in_RAX;
  if (nargs == 0) {
    pxVar1 = ctxt->context;
    pxVar2 = xmlNodeGetContent(pxVar1->node);
    if (pxVar2 == (xmlChar *)0x0) {
      pxVar2 = xmlStrdup("");
    }
    pxVar3 = xmlXPathCacheWrapString(pxVar1,pxVar2);
    valuePush(ctxt,pxVar3);
    nargs = 1;
  }
  if (nargs == 1) {
    if (ctxt->valueFrame < ctxt->valueNr) {
      if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type != XPATH_STRING)) {
        xmlXPathStringFunction(ctxt,1);
      }
      if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type == XPATH_STRING)) {
        pxVar3 = valuePop(ctxt);
        str = pxVar3->stringval;
        buf = xmlBufCreate();
        if (str == (byte *)0x0 || buf == (xmlBufPtr)0x0) {
LAB_001e57c8:
          xmlXPathReleaseObject(ctxt->context,pxVar3);
          return;
        }
        while (((ulong)*str < 0x21 && ((0x100002600U >> ((ulong)*str & 0x3f) & 1) != 0))) {
          str = str + 1;
        }
        uStack_38 = uStack_38 & 0xffffffffffffff;
LAB_001e5750:
        uVar4 = (ulong)*str;
        if (uVar4 < 0x21) {
          if ((0x100002600U >> (uVar4 & 0x3f) & 1) == 0) {
            if (uVar4 != 0) goto LAB_001e5770;
            pxVar1 = ctxt->context;
            pxVar2 = xmlBufContent(buf);
            value = xmlXPathCacheNewString(pxVar1,pxVar2);
            valuePush(ctxt,value);
            xmlBufFree(buf);
            goto LAB_001e57c8;
          }
          uStack_38 = CONCAT17(0x20,(undefined7)uStack_38);
        }
        else {
LAB_001e5770:
          if (uStack_38._7_1_ != '\0') {
            xmlBufAdd(buf,(xmlChar *)((long)&uStack_38 + 7),1);
            uStack_38 = uStack_38 & 0xffffffffffffff;
          }
          xmlBufAdd(buf,str,1);
        }
        str = str + 1;
        goto LAB_001e5750;
      }
      error = 0xb;
    }
    else {
      error = 0x17;
    }
  }
  else {
    error = 0xc;
  }
  xmlXPathErr(ctxt,error);
  return;
}

Assistant:

void
xmlXPathNormalizeFunction(xmlXPathParserContextPtr ctxt, int nargs) {
  xmlXPathObjectPtr obj = NULL;
  xmlChar *source = NULL;
  xmlBufPtr target;
  xmlChar blank;

  if (ctxt == NULL) return;
  if (nargs == 0) {
    /* Use current context node */
      valuePush(ctxt,
	  xmlXPathCacheWrapString(ctxt->context,
	    xmlXPathCastNodeToString(ctxt->context->node)));
    nargs = 1;
  }

  CHECK_ARITY(1);
  CAST_TO_STRING;
  CHECK_TYPE(XPATH_STRING);
  obj = valuePop(ctxt);
  source = obj->stringval;

  target = xmlBufCreate();
  if (target && source) {

    /* Skip leading whitespaces */
    while (IS_BLANK_CH(*source))
      source++;

    /* Collapse intermediate whitespaces, and skip trailing whitespaces */
    blank = 0;
    while (*source) {
      if (IS_BLANK_CH(*source)) {
	blank = 0x20;
      } else {
	if (blank) {
	  xmlBufAdd(target, &blank, 1);
	  blank = 0;
	}
	xmlBufAdd(target, source, 1);
      }
      source++;
    }
    valuePush(ctxt, xmlXPathCacheNewString(ctxt->context,
	xmlBufContent(target)));
    xmlBufFree(target);
  }
  xmlXPathReleaseObject(ctxt->context, obj);
}